

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
* __thiscall
Centaurus::ATNNode<wchar_t>::get_entry_exit_wide
          (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *__return_storage_ptr__,ATNNode<wchar_t> *this,wstring *prefix)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> bStack_58;
  wstring local_38;
  
  if (this->m_type == RegularTerminal) {
    std::operator+(&bStack_58,prefix,L"_S0");
    NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::get_exit_wide
              (&local_38,&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>,prefix
              );
    std::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_true>
              (__return_storage_ptr__,&bStack_58,&local_38);
    std::__cxx11::wstring::~wstring((wstring *)&local_38);
    std::__cxx11::wstring::~wstring((wstring *)&bStack_58);
  }
  else {
    std::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_true>
              (__return_storage_ptr__,prefix,prefix);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::wstring, std::wstring> get_entry_exit_wide(const std::wstring& prefix) const
	{
		if (m_type == ATNNodeType::RegularTerminal)
		{
			return std::pair<std::wstring, std::wstring>(m_nfa.get_entry_wide(prefix), m_nfa.get_exit_wide(prefix));
		}
		else
		{
			return std::pair<std::wstring, std::wstring>(prefix, prefix);
		}
	}